

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestDynamicExtensions_DynamicMessageType::_InternalSerialize
          (TestDynamicExtensions_DynamicMessageType *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  
  if ((undefined1  [12])((undefined1  [12])this->field_0 & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x834,(this->field_0)._impl_.dynamic_field_,puVar2);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestDynamicExtensions_DynamicMessageType::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestDynamicExtensions_DynamicMessageType& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestDynamicExtensions.DynamicMessageType)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 dynamic_field = 2100;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        2100, this_._internal_dynamic_field(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestDynamicExtensions.DynamicMessageType)
  return target;
}